

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

llama_pos __thiscall
llama_kv_cache_unified::seq_pos_max(llama_kv_cache_unified *this,llama_seq_id seq_id)

{
  pointer plVar1;
  _Base_ptr p_Var2;
  int iVar3;
  ulong uVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  
  if ((ulong)this->size != 0) {
    plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = 0;
    iVar3 = 0;
    do {
      p_Var5 = (_Rb_tree_header *)((long)&plVar1[uVar4].seq_id._M_t._M_impl + 8);
      p_Var6 = (_Base_ptr)p_Var5;
      for (p_Var2 = *(_Base_ptr *)((long)&plVar1[uVar4].seq_id._M_t._M_impl + 0x10);
          (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < seq_id]) {
        if (seq_id <= (int)*(size_t *)(p_Var2 + 1)) {
          p_Var6 = p_Var2;
        }
      }
      p_Var7 = p_Var5;
      if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
         (p_Var7 = (_Rb_tree_header *)p_Var6,
         seq_id < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
        p_Var7 = p_Var5;
      }
      if ((p_Var7 != p_Var5) && (iVar3 <= plVar1[uVar4].pos)) {
        iVar3 = plVar1[uVar4].pos;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != this->size);
    return iVar3;
  }
  return 0;
}

Assistant:

llama_pos llama_kv_cache_unified::seq_pos_max(llama_seq_id seq_id) const {
    llama_pos result = 0;

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id)) {
            result = std::max(result, cells[i].pos);
        }
    }

    return result;
}